

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O3

LispPTR LCFindVarIndex(LispPTR iv,LispPTR object)

{
  undefined4 *puVar1;
  ulong uVar2;
  DLword *pDVar3;
  LispPTR datum;
  LispPTR LVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar2 = (ulong)object;
  if (atom_instance == 0) {
    LCinit();
  }
  uVar6 = *(ushort *)((ulong)(object >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  uVar6 = *(uint *)((long)DTDspace + (ulong)uVar6 * 4 + (ulong)(uVar6 << 5)) & 0xfffffff;
  if ((uVar6 == atom_instance) || (uVar6 == atom_class)) {
    if ((object & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
    }
    pDVar3 = Lisp_world;
    uVar6 = *(uint *)(Lisp_world + uVar2 + 2);
    uVar5 = (ulong)(((uVar6 ^ iv) & 0x3ff) << 4);
    puVar1 = (undefined4 *)((long)&LCIVCache->iNames + uVar5);
    if ((*(uint *)((long)&LCIVCache->iNames + uVar5) == uVar6) && (puVar1[1] == iv)) {
      LVar4 = puVar1[2];
    }
    else {
      LVar4 = 0;
      if (((*(ushort *)((ulong)(uVar6 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) &&
         (datum = cdr(uVar6), datum != 0)) {
        uVar6 = 0;
        do {
          LVar4 = car(datum);
          if (LVar4 == iv) {
            *puVar1 = *(undefined4 *)(pDVar3 + uVar2 + 2);
            puVar1[1] = iv;
            puVar1[2] = uVar6 | 0xe0000;
            return uVar6 | 0xe0000;
          }
          uVar6 = uVar6 + 1;
          datum = cdr(datum);
        } while (datum != 0);
        LVar4 = 0;
      }
    }
  }
  else {
    lcfuncall(atom_FindVarIndex_LCUFN,2,3);
    LVar4 = 0xfffffffe;
  }
  return LVar4;
}

Assistant:

LispPTR LCFindVarIndex(LispPTR iv, LispPTR object) {
  struct LCInstance *objptr;
  struct LCIVCacheEntry *ce;
  LispPTR iNames;

  LC_INIT;

  INSTANCE_CLASS_OR_PUNT(object, atom_FindVarIndex_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  ce = &(LCIVCache[IV_CACHE_INDEX((iNames = objptr->iNames), iv)]);
  if (ce->iNames == iNames && ce->iv == iv) return ce->index;

  if (!Listp(iNames)) return NIL_PTR; /* FastFindIndex lisp macro (& others?) */
                                      /* needs this check too ! */
  {
    int i;

    for (i = 0; (iNames = cdr(iNames)) != NIL_PTR; i++) {
      if (car(iNames) == iv) {
        ce->iNames = objptr->iNames;
        ce->iv = iv;
        return (ce->index = SMALLP_FROM_POSINT(i));
      }
    }
    return NIL_PTR;
  }
}